

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_ipairs(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  int iVar2;
  TRef TVar3;
  long in_RSI;
  long in_RDI;
  undefined4 unaff_retaddr;
  TRef tr;
  MMS in_stack_00000044;
  RecordFFData *in_stack_00000048;
  jit_State *in_stack_00000050;
  
  uVar1 = **(uint **)(in_RDI + 0x80);
  iVar2 = recff_metacall(in_stack_00000050,in_stack_00000048,in_stack_00000044);
  if ((iVar2 == 0) && ((uVar1 & 0x1f000000) == 0xb000000)) {
    TVar3 = lj_ir_kgc(J,(GCobj *)rd,tr);
    **(TRef **)(in_RDI + 0x80) = TVar3;
    *(uint *)(*(long *)(in_RDI + 0x80) + 4) = uVar1;
    TVar3 = lj_ir_kint((jit_State *)CONCAT44(tr,unaff_retaddr),(int32_t)((ulong)in_RDI >> 0x20));
    *(TRef *)(*(long *)(in_RDI + 0x80) + 8) = TVar3;
    *(undefined8 *)(in_RSI + 8) = 3;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_ipairs(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (!((LJ_52 || (LJ_HASFFI && tref_iscdata(tr))) &&
	recff_metacall(J, rd, MM_ipairs))) {
    if (tref_istab(tr)) {
      J->base[0] = lj_ir_kfunc(J, funcV(&J->fn->c.upvalue[0]));
      J->base[1] = tr;
      J->base[2] = lj_ir_kint(J, 0);
      rd->nres = 3;
    }  /* else: Interpreter will throw. */
  }
}